

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell.hpp
# Opt level: O0

size_t __thiscall lattice::unitcell::add_bond(unitcell *this,size_t s,size_t t,offset_t *os,int tp)

{
  offset_t *poVar1;
  vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_> *pvVar2;
  offset_t *poVar3;
  invalid_argument *piVar4;
  bond_t *this_00;
  bond_t *pbVar5;
  offset_t *in_RDX;
  vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_> *in_RSI;
  unitcell *in_RDI;
  size_t b;
  value_type *__x;
  EigenBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff40;
  undefined1 *t_00;
  size_t in_stack_ffffffffffffff58;
  undefined1 local_78 [56];
  size_type local_40;
  offset_t *local_18;
  vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pvVar2 = (vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_> *)
           num_sites((unitcell *)0x11914e);
  poVar1 = local_18;
  if (in_RSI < pvVar2) {
    poVar3 = (offset_t *)num_sites((unitcell *)0x119172);
    if (poVar1 < poVar3) {
      this_00 = (bond_t *)
                Eigen::EigenBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::size
                          (in_stack_ffffffffffffff40);
      pbVar5 = (bond_t *)dimension(in_RDI);
      if (this_00 != pbVar5) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar4,"unitcell offset dimension mismatch");
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      __x = (value_type *)&in_RDI->bonds_;
      local_40 = std::vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>
                 ::size((vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>
                         *)__x);
      t_00 = local_78;
      Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<long,__1,_1,_0,__1,_1> *)local_10,(Matrix<long,__1,_1,_0,__1,_1> *)__x);
      bond_t::bond_t(this_00,in_stack_ffffffffffffff58,(size_t)t_00,local_18,
                     (int)((ulong)local_10 >> 0x20));
      std::vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>::push_back
                (local_10,__x);
      bond_t::~bond_t((bond_t *)0x1192ec);
      Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x1192f6);
      return local_40;
    }
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"site index out of range");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::size_t add_bond(std::size_t s, std::size_t t, const offset_t& os, int tp) {
    if (s >= num_sites() || t >= num_sites())
      throw std::invalid_argument("site index out of range");
    if (std::size_t(os.size()) != dimension())
      throw std::invalid_argument("unitcell offset dimension mismatch");
    std::size_t b = bonds_.size();
    bonds_.push_back(bond_t(s, t, os, tp));
    return b;
  }